

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

int __thiscall ON_SubD::SolidOrientation(ON_SubD *this)

{
  element_type *peVar1;
  ON_SubDLevel *this_00;
  bool bHasBoundary;
  bool bIsOriented;
  bool bIsManifold;
  int solid_orientation;
  bool local_f;
  bool local_e;
  bool local_d;
  int local_c;
  
  local_d = false;
  local_c = 0;
  local_e = false;
  local_f = false;
  peVar1 = (this->m_subdimple_sp).super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if ((peVar1 == (element_type *)0x0) ||
     (this_00 = peVar1->m_active_level, this_00 == (ON_SubDLevel *)0x0)) {
    this_00 = &ON_SubDLevel::Empty;
  }
  ON_SubDLevel::GetTopologicalAttributes(this_00,&local_d,&local_e,&local_f,&local_c);
  return local_c;
}

Assistant:

int ON_SubD::SolidOrientation() const
{
  bool bIsManifold = false;
  bool bIsOriented = false;
  bool bHasBoundary = false;
  int solid_orientation = 0;
  ActiveLevel().GetTopologicalAttributes(bIsManifold, bIsOriented, bHasBoundary, solid_orientation);
  return solid_orientation;
}